

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall
QDefaultAnimationDriver::QDefaultAnimationDriver(QDefaultAnimationDriver *this,QUnifiedTimer *timer)

{
  long lVar1;
  QObjectData *in_RSI;
  Object *in_RDI;
  long in_FS_OFFSET;
  ConnectionType unaff_retaddr;
  Connection *in_stack_ffffffffffffff70;
  QObject *in_stack_ffffffffffffff88;
  QAnimationDriver *in_stack_ffffffffffffff90;
  offset_in_QDefaultAnimationDriver_to_subr *slot;
  Object *sender;
  code *signal;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sender = in_RDI;
  QAnimationDriver::QAnimationDriver(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  (in_RDI->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_00be91f0;
  QBasicTimer::QBasicTimer((QBasicTimer *)(in_RDI + 1));
  in_RDI[1].super_QObject.d_ptr.d = in_RSI;
  signal = startTimer;
  slot = (offset_in_QDefaultAnimationDriver_to_subr *)0x0;
  QObject::connect<void(QAnimationDriver::*)(),void(QDefaultAnimationDriver::*)()>
            (sender,0x66aa30,(ContextType *)in_RSI,(offset_in_QDefaultAnimationDriver_to_subr *)0x0,
             unaff_retaddr);
  QMetaObject::Connection::~Connection(in_stack_ffffffffffffff70);
  QObject::connect<void(QAnimationDriver::*)(),void(QDefaultAnimationDriver::*)()>
            (sender,(offset_in_QAnimationDriver_to_subr)signal,(ContextType *)in_RSI,slot,
             unaff_retaddr);
  QMetaObject::Connection::~Connection(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDefaultAnimationDriver::QDefaultAnimationDriver(QUnifiedTimer *timer)
    : QAnimationDriver(nullptr), m_unified_timer(timer)
{
    connect(this, &QAnimationDriver::started, this, &QDefaultAnimationDriver::startTimer);
    connect(this, &QAnimationDriver::stopped, this, &QDefaultAnimationDriver::stopTimer);
}